

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEdit::setPlaceholderText(QPlainTextEdit *this,QString *placeholderText)

{
  QPlainTextEditPrivate *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  QStringView QVar4;
  QStringView QVar5;
  
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar1 = (this_00->placeholderText).d.size;
  lVar2 = (placeholderText->d).size;
  if (lVar1 == lVar2) {
    QVar4.m_data = (this_00->placeholderText).d.ptr;
    QVar4.m_size = lVar1;
    QVar5.m_data = (placeholderText->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') {
      return;
    }
  }
  QString::operator=(&this_00->placeholderText,(QString *)placeholderText);
  QPlainTextEditPrivate::updatePlaceholderVisibility(this_00);
  return;
}

Assistant:

void QPlainTextEdit::setPlaceholderText(const QString &placeholderText)
{
    Q_D(QPlainTextEdit);
    if (d->placeholderText != placeholderText) {
        d->placeholderText = placeholderText;
        d->updatePlaceholderVisibility();
    }
}